

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

result * __thiscall
lest::expression_lhs::operator_cast_to_result(result *__return_storage_ptr__,expression_lhs *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  lest lVar2;
  size_type sVar3;
  expected<InitList,_char> *in_RDX;
  ForNonContainerNonPointer<nonstd::expected_lite::expected<InitList,_char>,_std::string> local_90;
  char *local_70;
  size_type local_68;
  char local_60 [8];
  undefined4 uStack_58;
  undefined4 uStack_54;
  lest local_50;
  undefined1 *local_48;
  long local_40;
  undefined1 local_38 [16];
  
  lVar2 = (*(lest **)this)[0x20];
  to_string<nonstd::expected_lite::expected<InitList,char>>(&local_90,*(lest **)this,in_RDX);
  sVar3 = local_90._M_string_length;
  paVar1 = &local_90.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p == paVar1) {
    uStack_58 = local_90.field_2._8_4_;
    uStack_54 = local_90.field_2._12_4_;
    local_70 = local_60;
  }
  else {
    local_70 = local_90._M_dataplus._M_p;
  }
  local_68 = local_90._M_string_length;
  local_90._M_string_length = 0;
  local_90.field_2._M_allocated_capacity._0_4_ =
       local_90.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  local_90._M_dataplus._M_p = (pointer)paVar1;
  local_50 = lVar2;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_70,local_70 + sVar3);
  __return_storage_ptr__->passed = (bool)local_50;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_48,local_48 + local_40);
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar1) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

operator result() { return result{ !!lhs, to_string( lhs ) }; }